

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments.cxx
# Opt level: O0

int testCommandLineArguments(int argc,char **argv)

{
  ulong uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  void *pvVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference ppcVar12;
  reference rVar13;
  string *local_5d8;
  reference local_260;
  reference local_250;
  reference local_240;
  ulong local_230;
  size_t cc;
  string *local_220;
  string local_218;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 auStack_198 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stl_strings_argument;
  char *valid_strings [4];
  undefined1 local_150 [8];
  vector<char_*,_std::allocator<char_*>_> strings_argument;
  undefined1 local_130 [4];
  bool valid_bools [3];
  vector<bool,_std::allocator<bool>_> bools_argument;
  double valid_doubles [3];
  vector<double,_std::allocator<double>_> doubles_argument;
  int valid_numbers [10];
  vector<int,_std::allocator<int>_> numbers_argument;
  int bool_arg2;
  bool bool_arg1;
  bool some_bool_variable1;
  bool some_bool_variable;
  string some_stl_string_variable;
  char *some_string_variable;
  double some_double_variable;
  int some_int_variable;
  undefined1 local_50 [8];
  CommandLineArguments arg;
  int res;
  char **argv_local;
  int argc_local;
  
  arg.StoreUnusedArgumentsFlag = false;
  arg._45_3_ = 0;
  cmsys::CommandLineArguments::CommandLineArguments((CommandLineArguments *)local_50);
  cmsys::CommandLineArguments::Initialize((CommandLineArguments *)local_50,argc,argv);
  cmsys::CommandLineArguments::SetClientData((CommandLineArguments *)local_50,random_ptr);
  cmsys::CommandLineArguments::SetUnknownArgumentCallback
            ((CommandLineArguments *)local_50,unknown_argument);
  some_double_variable._0_4_ = 10;
  some_string_variable = (char *)0x4024333333333333;
  some_stl_string_variable.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&bool_arg2,"",
             (allocator *)
             ((long)&numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._5_1_ = 0;
  numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_1_ = 0;
  numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(valid_numbers + 8));
  valid_numbers[6] = 7;
  valid_numbers[7] = 1;
  valid_numbers[2] = 7;
  valid_numbers[3] = 1;
  valid_numbers[4] = 3;
  valid_numbers[5] = 9;
  valid_numbers[0] = 8;
  valid_numbers[1] = 3;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(valid_doubles + 2));
  valid_doubles[1] = 22.0;
  valid_doubles[0] = 1.31;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_130)
  ;
  strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_2_ = 0x101;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)local_150);
  stl_strings_argument.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_192bb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(auStack_198 + 8));
  cc._3_1_ = 1;
  local_220 = &local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"ken",(allocator *)((long)&cc + 7));
  local_220 = (string *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"brad",(allocator *)((long)&cc + 6));
  local_220 = (string *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"bill",(allocator *)((long)&cc + 5));
  local_220 = (string *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"andy",(allocator *)((long)&cc + 4));
  cc._3_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&cc + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cc + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cc + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cc + 7));
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"--some-int-variable",SPACE_ARGUMENT,
             (int *)&some_double_variable,"Set some random int variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"--some-double-variable",CONCAT_ARGUMENT,
             (double *)&some_string_variable,"Set some random double variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"--some-string-variable",EQUAL_ARGUMENT,
             (char **)((long)&some_stl_string_variable.field_2 + 8),
             "Set some random string variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"--some-stl-string-variable",EQUAL_ARGUMENT,
             (string *)&bool_arg2,"Set some random stl string variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"--some-bool-variable",EQUAL_ARGUMENT,
             (bool *)((long)&numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 6),
             "Set some random bool variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"--another-bool-variable",NO_ARGUMENT,
             (bool *)((long)&numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 5),
             "Set some random bool variable 1");
  cmsys::CommandLineArguments::AddBooleanArgument
            ((CommandLineArguments *)local_50,"--set-bool-arg1",
             (bool *)((long)&numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 4),
             "Test AddBooleanArgument 1");
  cmsys::CommandLineArguments::AddBooleanArgument
            ((CommandLineArguments *)local_50,"--set-bool-arg2",
             (int *)&numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,"Test AddBooleanArgument 2");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"--some-multi-argument",MULTI_ARGUMENT,
             (vector<int,_std::allocator<int>_> *)(valid_numbers + 8),
             "Some multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"-N",SPACE_ARGUMENT,
             (vector<double,_std::allocator<double>_> *)(valid_doubles + 2),
             "Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"-BB",CONCAT_ARGUMENT,
             (vector<bool,_std::allocator<bool>_> *)local_130,
             "Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"-SS",EQUAL_ARGUMENT,
             (vector<char_*,_std::allocator<char_*>_> *)local_150,
             "Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_50,"-SSS",MULTI_ARGUMENT,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(auStack_198 + 8),"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"-A",NO_ARGUMENT,argument,random_ptr,
             "Some option -A. This option has a multiline comment. It should demonstrate how the code splits lines."
            );
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"-B",SPACE_ARGUMENT,argument,random_ptr,
             "Option -B takes argument with space");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"-C",EQUAL_ARGUMENT,argument,random_ptr,
             "Option -C takes argument after =");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"-D",CONCAT_ARGUMENT,argument,random_ptr,
             "This option takes concatinated argument");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"--long1",NO_ARGUMENT,argument,random_ptr,"-A");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"--long2",SPACE_ARGUMENT,argument,random_ptr,"-B");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"--long3",EQUAL_ARGUMENT,argument,random_ptr,
             "Same as -C but a bit different");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_50,"--long4",CONCAT_ARGUMENT,argument,random_ptr,"-C");
  iVar4 = cmsys::CommandLineArguments::Parse((CommandLineArguments *)local_50);
  if (iVar4 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Problem parsing arguments");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    arg.StoreUnusedArgumentsFlag = true;
    arg._45_3_ = 0;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Help: ");
  pcVar6 = cmsys::CommandLineArguments::GetHelp((CommandLineArguments *)local_50);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Some int variable was set to: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar5,some_double_variable._0_4_);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Some double variable was set to: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar5,(double)some_string_variable);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  if ((some_stl_string_variable.field_2._8_8_ == 0) ||
     (iVar4 = strcmp((char *)some_stl_string_variable.field_2._8_8_,"test string with space"),
     iVar4 != 0)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting string variable");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    arg.StoreUnusedArgumentsFlag = true;
    arg._45_3_ = 0;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Some string variable was set to: ");
    poVar5 = std::operator<<(poVar5,(char *)some_stl_string_variable.field_2._8_8_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if (some_stl_string_variable.field_2._8_8_ != 0) {
      operator_delete__((void *)some_stl_string_variable.field_2._8_8_);
    }
  }
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(valid_numbers + 8));
  if (sVar8 == 10) {
    std::operator<<((ostream *)&std::cout,"numbers_argument argument set:");
    for (local_230 = 0; local_230 < 10; local_230 = local_230 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(valid_numbers + 8),local_230);
      std::ostream::operator<<(poVar5,*pvVar9);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(valid_numbers + 8),local_230);
      bVar3 = CompareTwoItemsOnList(*pvVar9,valid_numbers[local_230 - 2]);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting numbers_argument. Value of "
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_230);
        poVar5 = std::operator<<(poVar5," is: [");
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(valid_numbers + 8),local_230);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar9);
        poVar5 = std::operator<<(poVar5,"] <> [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,valid_numbers[local_230 - 2]);
        poVar5 = std::operator<<(poVar5,"]");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        arg.StoreUnusedArgumentsFlag = true;
        arg._45_3_ = 0;
        break;
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting numbers_argument. Size is: ");
    sVar8 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(valid_numbers + 8));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
    poVar5 = std::operator<<(poVar5," should be: ");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,10);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    arg.StoreUnusedArgumentsFlag = true;
    arg._45_3_ = 0;
  }
  sVar8 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(valid_doubles + 2));
  if (sVar8 == 3) {
    std::operator<<((ostream *)&std::cout,"doubles_argument argument set:");
    for (local_230 = 0; local_230 < 3; local_230 = local_230 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(valid_doubles + 2),local_230)
      ;
      std::ostream::operator<<(poVar5,*pvVar10);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(valid_doubles + 2),local_230)
      ;
      bVar3 = CompareTwoItemsOnList(*pvVar10,valid_doubles[local_230 - 1]);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting doubles_argument. Value of "
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_230);
        poVar5 = std::operator<<(poVar5," is: [");
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(valid_doubles + 2),
                             local_230);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar10);
        poVar5 = std::operator<<(poVar5,"] <> [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,valid_doubles[local_230 - 1]);
        poVar5 = std::operator<<(poVar5,"]");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        arg.StoreUnusedArgumentsFlag = true;
        arg._45_3_ = 0;
        break;
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting doubles_argument. Size is: ");
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(valid_doubles + 2));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
    poVar5 = std::operator<<(poVar5," should be: ");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,3);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    arg.StoreUnusedArgumentsFlag = true;
    arg._45_3_ = 0;
  }
  sVar8 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)local_130);
  if (sVar8 == 3) {
    std::operator<<((ostream *)&std::cout,"bools_argument argument set:");
    for (local_230 = 0; local_230 < 3; local_230 = local_230 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_130,local_230);
      local_240 = rVar13;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_240);
      std::ostream::operator<<(poVar5,bVar3);
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_130,local_230);
      local_250 = rVar13;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_250);
      bVar3 = CompareTwoItemsOnList(bVar3,(bool)(local_130[local_230 - 4] & 1));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting bools_argument. Value of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_230);
        poVar5 = std::operator<<(poVar5," is: [");
        local_260 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_130,local_230);
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_260);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar3);
        poVar5 = std::operator<<(poVar5,"] <> [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(local_130[local_230 - 4] & 1));
        poVar5 = std::operator<<(poVar5,"]");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        arg.StoreUnusedArgumentsFlag = true;
        arg._45_3_ = 0;
        break;
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting bools_argument. Size is: ");
    sVar8 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_130);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
    poVar5 = std::operator<<(poVar5," should be: ");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,3);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    arg.StoreUnusedArgumentsFlag = true;
    arg._45_3_ = 0;
  }
  sVar8 = std::vector<char_*,_std::allocator<char_*>_>::size
                    ((vector<char_*,_std::allocator<char_*>_> *)local_150);
  if (sVar8 == 4) {
    std::operator<<((ostream *)&std::cout,"strings_argument argument set:");
    for (local_230 = 0; local_230 < 4; local_230 = local_230 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      ppcVar12 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                           ((vector<char_*,_std::allocator<char_*>_> *)local_150,local_230);
      std::operator<<(poVar5,*ppcVar12);
      ppcVar12 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                           ((vector<char_*,_std::allocator<char_*>_> *)local_150,local_230);
      bVar3 = CompareTwoItemsOnList(*ppcVar12,valid_strings[local_230 - 1]);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting strings_argument. Value of "
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_230);
        poVar5 = std::operator<<(poVar5," is: [");
        ppcVar12 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                             ((vector<char_*,_std::allocator<char_*>_> *)local_150,local_230);
        poVar5 = std::operator<<(poVar5,*ppcVar12);
        poVar5 = std::operator<<(poVar5,"] <> [");
        poVar5 = std::operator<<(poVar5,valid_strings[local_230 - 1]);
        poVar5 = std::operator<<(poVar5,"]");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        arg.StoreUnusedArgumentsFlag = true;
        arg._45_3_ = 0;
        break;
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting strings_argument. Size is: ");
    sVar8 = std::vector<char_*,_std::allocator<char_*>_>::size
                      ((vector<char_*,_std::allocator<char_*>_> *)local_150);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
    poVar5 = std::operator<<(poVar5," should be: ");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,4);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    arg.StoreUnusedArgumentsFlag = true;
    arg._45_3_ = 0;
  }
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(auStack_198 + 8));
  if (sVar8 == 4) {
    std::operator<<((ostream *)&std::cout,"stl_strings_argument argument set:");
    for (local_230 = 0; local_230 < 4; local_230 = local_230 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(auStack_198 + 8),local_230);
      std::operator<<(poVar5,(string *)pvVar11);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(auStack_198 + 8),local_230);
      bVar3 = CompareTwoItemsOnList(pvVar11,&local_218 + local_230);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Problem setting stl_strings_argument. Value of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_230);
        poVar5 = std::operator<<(poVar5," is: [");
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(auStack_198 + 8),local_230);
        poVar5 = std::operator<<(poVar5,(string *)pvVar11);
        poVar5 = std::operator<<(poVar5,"] <> [");
        poVar5 = std::operator<<(poVar5,(string *)(&local_218 + local_230));
        poVar5 = std::operator<<(poVar5,"]");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        arg.StoreUnusedArgumentsFlag = true;
        arg._45_3_ = 0;
        break;
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Problem setting stl_strings_argument. Size is: "
                            );
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(auStack_198 + 8));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
    poVar5 = std::operator<<(poVar5," should be: ");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,4);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    arg.StoreUnusedArgumentsFlag = true;
    arg._45_3_ = 0;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Some STL String variable was set to: ");
  poVar5 = std::operator<<(poVar5,(string *)&bool_arg2);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Some bool variable was set to: ");
  pvVar7 = (void *)std::ostream::operator<<
                             (poVar5,(bool)(numbers_argument.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Some bool variable was set to: ");
  pvVar7 = (void *)std::ostream::operator<<
                             (poVar5,(bool)(numbers_argument.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage._5_1_ & 1));
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"bool_arg1 variable was set to: ");
  pvVar7 = (void *)std::ostream::operator<<
                             (poVar5,(bool)(numbers_argument.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage._4_1_ & 1));
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"bool_arg2 variable was set to: ");
  pvVar7 = (void *)std::ostream::operator<<
                             (poVar5,(int)numbers_argument.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_230 = 0;
  while( true ) {
    uVar1 = local_230;
    sVar8 = std::vector<char_*,_std::allocator<char_*>_>::size
                      ((vector<char_*,_std::allocator<char_*>_> *)local_150);
    uVar2 = arg._44_4_;
    if (sVar8 <= uVar1) break;
    ppcVar12 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                         ((vector<char_*,_std::allocator<char_*>_> *)local_150,local_230);
    if (*ppcVar12 != (value_type)0x0) {
      operator_delete__(*ppcVar12);
    }
    ppcVar12 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                         ((vector<char_*,_std::allocator<char_*>_> *)local_150,local_230);
    *ppcVar12 = (value_type)0x0;
    local_230 = local_230 + 1;
  }
  local_5d8 = (string *)auStack_198;
  do {
    local_5d8 = local_5d8 + -1;
    std::__cxx11::string::~string((string *)local_5d8);
  } while (local_5d8 != &local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(auStack_198 + 8));
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)local_150);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_130);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)(valid_doubles + 2));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)(valid_numbers + 8));
  std::__cxx11::string::~string((string *)&bool_arg2);
  cmsys::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_50);
  return uVar2;
}

Assistant:

int testCommandLineArguments(int argc, char* argv[])
{
  // Example run: ./testCommandLineArguments --some-int-variable 4
  // --another-bool-variable --some-bool-variable=yes
  // --some-stl-string-variable=foobar --set-bool-arg1 --set-bool-arg2
  // --some-string-variable=hello

  int res = 0;
  kwsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);

  // For error handling
  arg.SetClientData(random_ptr);
  arg.SetUnknownArgumentCallback(unknown_argument);

  int some_int_variable = 10;
  double some_double_variable = 10.10;
  char* some_string_variable = 0;
  std::string some_stl_string_variable = "";
  bool some_bool_variable = false;
  bool some_bool_variable1 = false;
  bool bool_arg1 = false;
  int bool_arg2 = 0;

  std::vector<int> numbers_argument;
  int valid_numbers[] = { 5, 1, 8, 3, 7, 1, 3, 9, 7, 1 };

  std::vector<double> doubles_argument;
  double valid_doubles[] = { 12.5, 1.31, 22 };

  std::vector<bool> bools_argument;
  bool valid_bools[] = { true, true, false };

  std::vector<char*> strings_argument;
  const char* valid_strings[] = { "andy", "bill", "brad", "ken" };

  std::vector<std::string> stl_strings_argument;
  std::string valid_stl_strings[] = { "ken", "brad", "bill", "andy" };

  typedef kwsys::CommandLineArguments argT;

  arg.AddArgument("--some-int-variable", argT::SPACE_ARGUMENT,
                  &some_int_variable, "Set some random int variable");
  arg.AddArgument("--some-double-variable", argT::CONCAT_ARGUMENT,
                  &some_double_variable, "Set some random double variable");
  arg.AddArgument("--some-string-variable", argT::EQUAL_ARGUMENT,
                  &some_string_variable, "Set some random string variable");
  arg.AddArgument("--some-stl-string-variable", argT::EQUAL_ARGUMENT,
                  &some_stl_string_variable,
                  "Set some random stl string variable");
  arg.AddArgument("--some-bool-variable", argT::EQUAL_ARGUMENT,
                  &some_bool_variable, "Set some random bool variable");
  arg.AddArgument("--another-bool-variable", argT::NO_ARGUMENT,
                  &some_bool_variable1, "Set some random bool variable 1");
  arg.AddBooleanArgument("--set-bool-arg1", &bool_arg1,
                         "Test AddBooleanArgument 1");
  arg.AddBooleanArgument("--set-bool-arg2", &bool_arg2,
                         "Test AddBooleanArgument 2");
  arg.AddArgument("--some-multi-argument", argT::MULTI_ARGUMENT,
                  &numbers_argument, "Some multiple values variable");
  arg.AddArgument("-N", argT::SPACE_ARGUMENT, &doubles_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-BB", argT::CONCAT_ARGUMENT, &bools_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-SS", argT::EQUAL_ARGUMENT, &strings_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-SSS", argT::MULTI_ARGUMENT, &stl_strings_argument,
                  "Some explicit multiple values variable");

  arg.AddCallback("-A", argT::NO_ARGUMENT, argument, random_ptr,
                  "Some option -A. This option has a multiline comment. It "
                  "should demonstrate how the code splits lines.");
  arg.AddCallback("-B", argT::SPACE_ARGUMENT, argument, random_ptr,
                  "Option -B takes argument with space");
  arg.AddCallback("-C", argT::EQUAL_ARGUMENT, argument, random_ptr,
                  "Option -C takes argument after =");
  arg.AddCallback("-D", argT::CONCAT_ARGUMENT, argument, random_ptr,
                  "This option takes concatinated argument");
  arg.AddCallback("--long1", argT::NO_ARGUMENT, argument, random_ptr, "-A");
  arg.AddCallback("--long2", argT::SPACE_ARGUMENT, argument, random_ptr, "-B");
  arg.AddCallback("--long3", argT::EQUAL_ARGUMENT, argument, random_ptr,
                  "Same as -C but a bit different");
  arg.AddCallback("--long4", argT::CONCAT_ARGUMENT, argument, random_ptr,
                  "-C");

  if (!arg.Parse()) {
    std::cerr << "Problem parsing arguments" << std::endl;
    res = 1;
  }
  std::cout << "Help: " << arg.GetHelp() << std::endl;

  std::cout << "Some int variable was set to: " << some_int_variable
            << std::endl;
  std::cout << "Some double variable was set to: " << some_double_variable
            << std::endl;
  if (some_string_variable &&
      strcmp(some_string_variable, "test string with space") == 0) {
    std::cout << "Some string variable was set to: " << some_string_variable
              << std::endl;
    delete[] some_string_variable;
  } else {
    std::cerr << "Problem setting string variable" << std::endl;
    res = 1;
  }
  size_t cc;
#define CompareTwoLists(list1, list_valid, lsize)                             \
  if (list1.size() != lsize) {                                                \
    std::cerr << "Problem setting " #list1 ". Size is: " << list1.size()      \
              << " should be: " << lsize << std::endl;                        \
    res = 1;                                                                  \
  } else {                                                                    \
    std::cout << #list1 " argument set:";                                     \
    for (cc = 0; cc < lsize; ++cc) {                                          \
      std::cout << " " << list1[cc];                                          \
      if (!CompareTwoItemsOnList(list1[cc], list_valid[cc])) {                \
        std::cerr << "Problem setting " #list1 ". Value of " << cc            \
                  << " is: [" << list1[cc] << "] <> [" << list_valid[cc]      \
                  << "]" << std::endl;                                        \
        res = 1;                                                              \
        break;                                                                \
      }                                                                       \
    }                                                                         \
    std::cout << std::endl;                                                   \
  }

  CompareTwoLists(numbers_argument, valid_numbers, 10);
  CompareTwoLists(doubles_argument, valid_doubles, 3);
  CompareTwoLists(bools_argument, valid_bools, 3);
  CompareTwoLists(strings_argument, valid_strings, 4);
  CompareTwoLists(stl_strings_argument, valid_stl_strings, 4);

  std::cout << "Some STL String variable was set to: "
            << some_stl_string_variable << std::endl;
  std::cout << "Some bool variable was set to: " << some_bool_variable
            << std::endl;
  std::cout << "Some bool variable was set to: " << some_bool_variable1
            << std::endl;
  std::cout << "bool_arg1 variable was set to: " << bool_arg1 << std::endl;
  std::cout << "bool_arg2 variable was set to: " << bool_arg2 << std::endl;
  std::cout << std::endl;

  for (cc = 0; cc < strings_argument.size(); ++cc) {
    delete[] strings_argument[cc];
    strings_argument[cc] = 0;
  }
  return res;
}